

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raplcap-msr-common.c
# Opt level: O0

uint64_t msr_set_limits(raplcap_msr_ctx *ctx,raplcap_zone zone,uint64_t msrval,
                       raplcap_limit *limit_long,raplcap_limit *limit_short)

{
  raplcap_limit *prVar1;
  uint64_t uVar2;
  uint8_t local_36;
  uint8_t local_35;
  uint8_t local_34;
  uint8_t local_33;
  uint8_t local_32;
  uint8_t local_31;
  uint8_t tw2_last;
  uint8_t tw2_first;
  uint8_t pl2_last;
  uint8_t tw1_last;
  uint8_t tw1_first;
  raplcap_limit *prStack_30;
  uint8_t pl1_last;
  raplcap_limit *limit_short_local;
  raplcap_limit *limit_long_local;
  uint64_t msrval_local;
  raplcap_msr_ctx *prStack_10;
  raplcap_zone zone_local;
  raplcap_msr_ctx *ctx_local;
  
  prStack_30 = limit_short;
  limit_short_local = limit_long;
  limit_long_local = (raplcap_limit *)msrval;
  msrval_local._4_4_ = zone;
  prStack_10 = ctx;
  if (ctx == (raplcap_msr_ctx *)0x0) {
    __assert_fail("ctx != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/powercap[P]raplcap/msr/raplcap-msr-common.c"
                  ,0x29f,
                  "uint64_t msr_set_limits(const raplcap_msr_ctx *, raplcap_zone, uint64_t, const raplcap_limit *, const raplcap_limit *)"
                 );
  }
  local_31 = '\x0e';
  local_32 = '\x11';
  local_33 = '\x17';
  local_34 = '.';
  local_35 = '1';
  local_36 = '7';
  zone_limits_quirks(ctx,zone,&local_31,&local_32,&local_33,&local_34,&local_35,&local_36,
                     (uint64_t *)0x0);
  prVar1 = limit_long_local;
  if (limit_short_local != (raplcap_limit *)0x0) {
    if (0.0 < limit_short_local->watts) {
      uVar2 = (*prStack_10->cfg[msrval_local._4_4_].to_msr_pl)
                        (limit_short_local->watts,prStack_10->power_units);
      limit_long_local = (raplcap_limit *)replace_bits((uint64_t)prVar1,uVar2,'\0',local_31);
    }
    prVar1 = limit_long_local;
    if (0.0 < limit_short_local->seconds) {
      uVar2 = (*prStack_10->cfg[msrval_local._4_4_].to_msr_tw)
                        (limit_short_local->seconds,prStack_10->time_units);
      limit_long_local = (raplcap_limit *)replace_bits((uint64_t)prVar1,uVar2,local_32,local_33);
    }
  }
  prVar1 = limit_long_local;
  if ((prStack_30 != (raplcap_limit *)0x0) && (1 < prStack_10->cfg[msrval_local._4_4_].constraints))
  {
    if (0.0 < prStack_30->watts) {
      uVar2 = (*prStack_10->cfg[msrval_local._4_4_].to_msr_pl)
                        (prStack_30->watts,prStack_10->power_units);
      limit_long_local = (raplcap_limit *)replace_bits((uint64_t)prVar1,uVar2,' ',local_34);
    }
    prVar1 = limit_long_local;
    if (0.0 < prStack_30->seconds) {
      if (msrval_local._4_4_ == RAPLCAP_ZONE_PSYS) {
        fprintf(_stderr,"%s [%s] ","[WARN] ","raplcap");
        fprintf(_stderr,"Not allowed to set PSys/Platform short term time window\n");
      }
      else {
        uVar2 = (*prStack_10->cfg[msrval_local._4_4_].to_msr_tw)
                          (prStack_30->seconds,prStack_10->time_units);
        limit_long_local = (raplcap_limit *)replace_bits((uint64_t)prVar1,uVar2,local_35,local_36);
      }
    }
  }
  return (uint64_t)limit_long_local;
}

Assistant:

uint64_t msr_set_limits(const raplcap_msr_ctx* ctx, raplcap_zone zone, uint64_t msrval,
                        const raplcap_limit* limit_long, const raplcap_limit* limit_short) {
  assert(ctx != NULL);
  uint8_t pl1_last = 14;
  uint8_t tw1_first = 17;
  uint8_t tw1_last = 23;
  uint8_t pl2_last = 46;
  uint8_t tw2_first = 49;
  uint8_t tw2_last = 55;
  zone_limits_quirks(ctx, zone, &pl1_last, &tw1_first, &tw1_last, &pl2_last, &tw2_first, &tw2_last, NULL);
  if (limit_long != NULL) {
    raplcap_log(DEBUG, "msr_set_limits: zone=%d, long_term:\n\ttime=%.12f s\n\tpower=%.12f W\n",
                zone, limit_long->seconds, limit_long->watts);
    if (limit_long->watts > 0) {
      msrval = replace_bits(msrval, ctx->cfg[zone].to_msr_pl(limit_long->watts, ctx->power_units), 0, pl1_last);
    }
    if (limit_long->seconds > 0) {
      msrval = replace_bits(msrval, ctx->cfg[zone].to_msr_tw(limit_long->seconds, ctx->time_units), tw1_first,
                            tw1_last);
    }
  }
  if (limit_short != NULL && HAS_SHORT_TERM(ctx, zone)) {
    raplcap_log(DEBUG, "msr_set_limits: zone=%d, short_term:\n\ttime=%.12f s\n\tpower=%.12f W\n",
                zone, limit_short->seconds, limit_short->watts);
    if (limit_short->watts > 0) {
      msrval = replace_bits(msrval, ctx->cfg[zone].to_msr_pl(limit_short->watts, ctx->power_units), 32, pl2_last);
    }
    if (limit_short->seconds > 0) {
      // 16.10.3: This field may have a hard-coded value in hardware and ignores values written by software.
      if (zone == RAPLCAP_ZONE_PSYS) {
        // Table 2-39: PSYS has power limit #2, but time window #2 is chosen by the processor
        raplcap_log(WARN, "Not allowed to set PSys/Platform short term time window\n");
      } else {
        msrval = replace_bits(msrval, ctx->cfg[zone].to_msr_tw(limit_short->seconds, ctx->time_units), tw2_first,
                              tw2_last);
      }
    }
  }
  return msrval;
}